

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

void __thiscall
proto2_unittest::TestPackedExtensionsLite::~TestPackedExtensionsLite(TestPackedExtensionsLite *this)

{
  ~TestPackedExtensionsLite(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TestPackedExtensionsLite::~TestPackedExtensionsLite() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestPackedExtensionsLite)
  SharedDtor(*this);
}